

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocTestApprovals.h
# Opt level: O2

void __thiscall
ApprovalTests::anon_unknown_1::DocTestApprovalListener::subcase_start
          (DocTestApprovalListener *this,SubcaseSignature *signature)

{
  String *in_RDX;
  string local_30;
  
  (anonymous_namespace)::DocTestApprovalListener::doctestToString_abi_cxx11_
            (&local_30,signature,in_RDX);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->currentTest
             ,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void subcase_start(const doctest::SubcaseSignature& signature) override
            {
                currentTest.sections.emplace_back(doctestToString(signature.m_name));
            }